

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValue.cpp
# Opt level: O1

uint __thiscall MockNamedValue::getUnsignedIntValue(MockNamedValue *this)

{
  int iVar1;
  bool bVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  TestTerminator *pTVar5;
  SimpleString local_30;
  
  SimpleString::SimpleString(&local_30,"int");
  bVar2 = operator==(&this->type_,&local_30);
  if (bVar2) {
    iVar1 = (this->value_).intValue_;
    SimpleString::~SimpleString(&local_30);
    if (-1 < iVar1) goto LAB_00126ef2;
  }
  else {
    SimpleString::~SimpleString(&local_30);
  }
  pUVar3 = UtestShell::getCurrent();
  pcVar4 = SimpleString::asCharString(&this->type_);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[9])
            (pUVar3,"unsigned int",pcVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MockNamedValue.cpp"
             ,0xd2,pTVar5);
LAB_00126ef2:
  return (this->value_).unsignedIntValue_;
}

Assistant:

unsigned int MockNamedValue::getUnsignedIntValue() const
{
    if(type_ == "int" && value_.intValue_ >= 0)
        return (unsigned int)value_.intValue_;
    else
    {
        STRCMP_EQUAL("unsigned int", type_.asCharString());
        return value_.unsignedIntValue_;
    }
}